

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::WriteXML(cmCTestLaunch *this)

{
  pointer pcVar1;
  string logXML;
  cmXMLWriter xml;
  cmGeneratedFileStream fxml;
  long *local_2d0 [2];
  long local_2c0 [2];
  string local_2b0;
  cmXMLWriter local_290;
  cmGeneratedFileStream local_260;
  
  pcVar1 = (this->LogDir)._M_dataplus._M_p;
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d0,pcVar1,pcVar1 + (this->LogDir)._M_string_length);
  std::__cxx11::string::append((char *)local_2d0);
  std::__cxx11::string::_M_append((char *)local_2d0,(ulong)(this->LogHash)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)local_2d0);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_260,(char *)local_2d0[0],false);
  cmXMLWriter::cmXMLWriter(&local_290,(ostream *)&local_260,2);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Failure","");
  cmXMLWriter::StartElement(&local_290,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = "Error";
  if (this->ExitCode == 0) {
    local_2b0._M_dataplus._M_p = "Warning";
  }
  cmXMLWriter::Attribute<char_const*>(&local_290,"type",(char **)&local_2b0);
  WriteXMLAction(this,&local_290);
  WriteXMLCommand(this,&local_290);
  WriteXMLResult(this,&local_290);
  WriteXMLLabels(this,&local_290);
  cmXMLWriter::EndElement(&local_290);
  cmXMLWriter::~cmXMLWriter(&local_290);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_260);
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  return;
}

Assistant:

void cmCTestLaunch::WriteXML()
{
  // Name the xml file.
  std::string logXML = this->LogDir;
  logXML += this->IsError()? "error-" : "warning-";
  logXML += this->LogHash;
  logXML += ".xml";

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML.c_str());
  cmXMLWriter xml(fxml, 2);
  xml.StartElement("Failure");
  xml.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(xml);
  this->WriteXMLCommand(xml);
  this->WriteXMLResult(xml);
  this->WriteXMLLabels(xml);
  xml.EndElement(); // Failure
}